

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Initialize.cpp
# Opt level: O1

void __thiscall glslang::TBuiltIns::TBuiltIns(TBuiltIns *this)

{
  TBuiltInParseables::TBuiltInParseables(&this->super_TBuiltInParseables);
  (this->super_TBuiltInParseables)._vptr_TBuiltInParseables = (_func_int **)&PTR__TBuiltIns_009409e0
  ;
  this->prefixes[1] = "";
  this->prefixes[8] = "i";
  this->prefixes[9] = "u";
  this->prefixes[3] = "f16";
  this->prefixes[4] = "i8";
  this->prefixes[5] = "u8";
  this->prefixes[6] = "i16";
  this->prefixes[7] = "u16";
  this->prefixes[10] = "i64";
  this->prefixes[0xb] = "u64";
  this->postfixes[2] = "2";
  this->postfixes[3] = "3";
  this->postfixes[4] = "4";
  this->dimMap[1] = 1;
  this->dimMap[2] = 2;
  this->dimMap[3] = 3;
  this->dimMap[4] = 3;
  this->dimMap[5] = 2;
  this->dimMap[6] = 1;
  this->dimMap[7] = 2;
  this->dimMap[8] = 2;
  return;
}

Assistant:

TBuiltIns::TBuiltIns()
{
    // Set up textual representations for making all the permutations
    // of texturing/imaging functions.
    prefixes[EbtFloat] =  "";
    prefixes[EbtInt]   = "i";
    prefixes[EbtUint]  = "u";
    prefixes[EbtFloat16] = "f16";
    prefixes[EbtInt8]  = "i8";
    prefixes[EbtUint8] = "u8";
    prefixes[EbtInt16]  = "i16";
    prefixes[EbtUint16] = "u16";
    prefixes[EbtInt64]  = "i64";
    prefixes[EbtUint64] = "u64";

    postfixes[2] = "2";
    postfixes[3] = "3";
    postfixes[4] = "4";

    // Map from symbolic class of texturing dimension to numeric dimensions.
    dimMap[Esd2D] = 2;
    dimMap[Esd3D] = 3;
    dimMap[EsdCube] = 3;
    dimMap[Esd1D] = 1;
    dimMap[EsdRect] = 2;
    dimMap[EsdBuffer] = 1;
    dimMap[EsdSubpass] = 2;  // potentially unused for now
    dimMap[EsdAttachmentEXT] = 2;  // potentially unused for now
}